

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::Program::~Program(Program *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Program_00179100;
  ppSVar1 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1) {
    if (*ppSVar2 != (Stmt *)0x0) {
      (*((*ppSVar2)->super_Node)._vptr_Node[1])();
    }
  }
  ppSVar2 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar2) {
    (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2;
  }
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->Stmts).
                                  super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2)
    ;
    return;
  }
  return;
}

Assistant:

~Program()
    {
        for(auto stmt: Stmts){
            delete  stmt;
            stmt = nullptr;
        }
        Stmts.clear();
    }